

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFPB
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Matrix<float,(unsigned_char)3,(unsigned_char)3> *this_00;
  float fVar1;
  float fVar2;
  double __x;
  double dVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  Vector local_170;
  Vector local_158;
  WorldCoordinates local_140;
  Vector local_110;
  Vector local_f8;
  WorldCoordinates local_e0;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> local_c0;
  Matrix<float,(unsigned_char)3,(unsigned_char)3> local_9c [8];
  TMATRIX IMatrix;
  TMATRIX R1;
  KFLOAT64 f64SkewScale;
  KFLOAT64 f64IScalar;
  KFLOAT64 f64Scalar;
  KFLOAT32 m_f32MagPow3;
  KFLOAT32 m_f32MagPow2;
  KFLOAT64 f64DeltaMag;
  KFLOAT32 totalTimeSinceReset_local;
  WorldCoordinates *PositionOut_local;
  DeadReckoningCalculator *this_local;
  
  __x = (double)((float)totalTimeSinceReset * (float)this->m_f64Magnitude);
  if (__x <= 1e-05) {
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_170,&this->m_initOrientationMatrixTranspose,&this->m_initLinearVelocity);
    DATA_TYPE::Vector::operator*(&local_158,&local_170,totalTimeSinceReset);
    DATA_TYPE::WorldCoordinates::operator+(&local_140,&this->m_initPosition,&local_158);
    DATA_TYPE::WorldCoordinates::operator=(PositionOut,&local_140);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_140);
    DATA_TYPE::Vector::~Vector(&local_158);
    DATA_TYPE::Vector::~Vector(&local_170);
  }
  else {
    fVar6 = (float)this->m_f64Magnitude * (float)this->m_f64Magnitude;
    fVar1 = (float)this->m_f64Magnitude;
    dVar3 = sin(__x);
    dVar4 = sin(__x);
    fVar2 = (float)this->m_f64Magnitude;
    dVar5 = cos(__x);
    IMatrix.Data[2]._4_8_ = *(undefined8 *)(this->m_wwMatrix).Data[0];
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::Matrix
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_9c);
    this_00 = (Matrix<float,(unsigned_char)3,(unsigned_char)3> *)(IMatrix.Data[2] + 1);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=
              (this_00,(__x - dVar3) / (double)(fVar6 * fVar1));
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*=(local_9c,dVar4 / (double)fVar2);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this_00,
               (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)local_9c);
    Matrix<float,(unsigned_char)3,(unsigned_char)3>::operator*
              (&local_c0,(Matrix<float,(unsigned_char)3,(unsigned_char)3> *)&this->m_SkewOmegaMatrix
               ,(1.0 - dVar5) / (double)fVar6);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator+=
              ((Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this_00,&local_c0);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_110,(Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)this_00,
               &this->m_initLinearVelocity);
    Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
              (&local_f8,&this->m_initOrientationMatrixTranspose,&local_110);
    DATA_TYPE::WorldCoordinates::operator+(&local_e0,&this->m_initPosition,&local_f8);
    DATA_TYPE::WorldCoordinates::operator=(PositionOut,&local_e0);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_e0);
    DATA_TYPE::Vector::~Vector(&local_f8);
    DATA_TYPE::Vector::~Vector(&local_110);
  }
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFPB( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    // See page 124 of IEEE 1278.1 - 1995 for more details on this and other dead reckoning equations.

    // Calculate Magnitude, scalars etc
    const KFLOAT64 f64DeltaMag = totalTimeSinceReset * m_f64Magnitude;
    if( f64DeltaMag > MAGIC_EPSILON )
    {
        KFLOAT32 m_f32MagPow2 = m_f64Magnitude * m_f64Magnitude;
        KFLOAT32 m_f32MagPow3 = m_f32MagPow2 * m_f64Magnitude;

        const KFLOAT64 f64Scalar = ( ( f64DeltaMag ) - sin( f64DeltaMag ) ) / m_f32MagPow3;
        const KFLOAT64 f64IScalar = sin( f64DeltaMag ) / m_f64Magnitude;
        const KFLOAT64 f64SkewScale = ( 1 - cos( f64DeltaMag ) ) / m_f32MagPow2 ;
        TMATRIX R1( m_wwMatrix ), IMatrix;
        R1 *= f64Scalar;
        IMatrix *= f64IScalar;
        R1 += IMatrix;
        R1 += ( m_SkewOmegaMatrix * f64SkewScale ); // RI - should be + instead of - IEEE 1278.1-1995.pdf page 128

        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * ( R1 * m_initLinearVelocity ) ) );
    }
    else
    {
        PositionOut = ( m_initPosition + ( m_initOrientationMatrixTranspose * m_initLinearVelocity * totalTimeSinceReset ) );
    }
}